

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::handle_file_request(Server *this,Request *req,Response *res,bool head)

{
  pointer pMVar1;
  bool bVar2;
  int iVar3;
  char *val;
  _Base_ptr p_Var4;
  pointer pMVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  string sub_path;
  
  pMVar5 = (this->base_dirs_).
           super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (this->base_dirs_).
           super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pMVar5 == pMVar1) goto LAB_0013a2d2;
    iVar3 = std::__cxx11::string::compare
                      ((ulong)&req->path,0,(string *)(pMVar5->mount_point)._M_string_length);
    if (iVar3 == 0) {
      std::__cxx11::string::substr((ulong)&path,(ulong)&req->path);
      std::operator+(&sub_path,"/",&path);
      std::__cxx11::string::~string((string *)&path);
      bVar2 = detail::is_valid_path(&sub_path);
      if (bVar2) {
        std::operator+(&path,&pMVar5->base_dir,&sub_path);
        if (path._M_dataplus._M_p[path._M_string_length - 1] == '/') {
          std::__cxx11::string::append((char *)&path);
        }
        bVar2 = detail::is_file(&path);
        if (bVar2) {
          detail::read_file(&path,&res->body);
          val = detail::find_content_type(&path,&this->file_extension_and_mimetype_map_);
          if (val != (char *)0x0) {
            Response::set_header(res,"Content-Type",val);
          }
          for (p_Var4 = (pMVar5->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              &(pMVar5->headers)._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var4;
              p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
            Response::set_header(res,*(char **)(p_Var4 + 1),(string *)(p_Var4 + 2));
          }
          bVar2 = detail::has_header(&req->headers,"Range");
          iVar3 = 200;
          if (bVar2) {
            iVar3 = 0xce;
          }
          res->status = iVar3;
          if ((!head) &&
             ((this->file_request_handler_).super__Function_base._M_manager != (_Manager_type)0x0))
          {
            std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
                      (&this->file_request_handler_,req,res);
          }
          std::__cxx11::string::~string((string *)&path);
          std::__cxx11::string::~string((string *)&sub_path);
LAB_0013a2d2:
          return pMVar5 != pMVar1;
        }
        std::__cxx11::string::~string((string *)&path);
      }
      std::__cxx11::string::~string((string *)&sub_path);
    }
    pMVar5 = pMVar5 + 1;
  } while( true );
}

Assistant:

inline bool Server::handle_file_request(const Request &req, Response &res,
                                        bool head) {
  for (const auto &entry : base_dirs_) {
    // Prefix match
    if (!req.path.compare(0, entry.mount_point.size(), entry.mount_point)) {
      std::string sub_path = "/" + req.path.substr(entry.mount_point.size());
      if (detail::is_valid_path(sub_path)) {
        auto path = entry.base_dir + sub_path;
        if (path.back() == '/') { path += "index.html"; }

        if (detail::is_file(path)) {
          detail::read_file(path, res.body);
          auto type =
              detail::find_content_type(path, file_extension_and_mimetype_map_);
          if (type) { res.set_header("Content-Type", type); }
          for (const auto &kv : entry.headers) {
            res.set_header(kv.first.c_str(), kv.second);
          }
          res.status = req.has_header("Range") ? 206 : 200;
          if (!head && file_request_handler_) {
            file_request_handler_(req, res);
          }
          return true;
        }
      }
    }
  }
  return false;
}